

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

uint FindNextPattern(uchar *buffer,uint size,uint offset,uchar *pattern,uint size_of_pattern)

{
  byte bVar1;
  int iVar2;
  void *__s2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  
  __s2 = operator_new__((ulong)(size_of_pattern * 8));
  if (size_of_pattern != 0) {
    uVar3 = 0;
    lVar4 = 0;
    do {
      bVar1 = pattern[uVar3];
      lVar4 = (long)(int)lVar4;
      uVar6 = 7;
      do {
        *(bool *)((long)__s2 + lVar4) = (bVar1 >> (uVar6 & 0x1f) & 1) != 0;
        lVar4 = lVar4 + 1;
        bVar7 = uVar6 != 0;
        uVar6 = uVar6 - 1;
      } while (bVar7);
      uVar3 = uVar3 + 1;
    } while (uVar3 != size_of_pattern);
  }
  uVar3 = (ulong)offset;
  if (offset < size) {
    uVar5 = (ulong)offset;
    do {
      iVar2 = bcmp(buffer + uVar5,__s2,(ulong)(size_of_pattern * 8));
      uVar3 = uVar5;
      if (iVar2 == 0) break;
      uVar5 = uVar5 + 1;
      uVar3 = (ulong)size;
    } while (size != uVar5);
  }
  operator_delete__(__s2);
  uVar6 = 0xffffffff;
  if ((uint)uVar3 != size) {
    uVar6 = (uint)uVar3;
  }
  return uVar6;
}

Assistant:

unsigned int FindNextPattern(unsigned char* buffer, unsigned int size, unsigned int offset,
                             const unsigned char* pattern, unsigned int size_of_pattern)
{
   // Convert pattern to bit array
   unsigned char* pattern_in_bits = new unsigned char[size_of_pattern * 8];
   int index = 0;
   for (unsigned int i = 0; i < size_of_pattern; i++)
   {
      for (int j = 0; j < 8; j++)
      {
         unsigned char c = ((pattern[i] >> (7 - j)) & 0x01);
         pattern_in_bits[index++] = c;
      }
   }

   // Find this array

   while (offset < size && memcmp(&buffer[offset], pattern_in_bits, size_of_pattern * 8) != 0)
   {
      ++offset;
   }

   delete[]pattern_in_bits;

   if (offset == size) return -1;
   return offset;
}